

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::do_actual_learning<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *ec_seq)

{
  example *peVar1;
  ostream *poVar2;
  vw_exception *pvVar3;
  cb_class cVar4;
  string local_1f0;
  string local_1d0;
  stringstream __msg;
  ostream local_1a0;
  
  peVar1 = test_adf_sequence(ec_seq);
  cVar4 = CB_ADF::get_observed_cost(ec_seq);
  (data->gen_cs).known_cost = cVar4;
  if (peVar1 != (example *)0x0) {
    switch(data->explore_type) {
    case 0:
      predict_or_learn_first<true>(data,base,ec_seq);
      return;
    case 1:
      predict_or_learn_greedy<true>(data,base,ec_seq);
      return;
    case 2:
      predict_or_learn_bag<true>(data,base,ec_seq);
      return;
    case 3:
      predict_or_learn_softmax<true>(data,base,ec_seq);
      return;
    case 4:
      predict_or_learn_cover<true>(data,base,ec_seq);
      return;
    case 5:
      predict_or_learn_regcb<true>(data,base,ec_seq);
      return;
    default:
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar2 = std::operator<<(&local_1a0,
                               "Unknown explorer type specified for contextual bandit learning: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_explore_adf.cc"
                 ,0x2ca,&local_1f0);
      __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  switch(data->explore_type) {
  case 0:
    predict_or_learn_first<false>(data,base,ec_seq);
    return;
  case 1:
    predict_or_learn_greedy<false>(data,base,ec_seq);
    return;
  case 2:
    predict_or_learn_bag<false>(data,base,ec_seq);
    return;
  case 3:
    predict_or_learn_softmax<false>(data,base,ec_seq);
    return;
  case 4:
    predict_or_learn_cover<false>(data,base,ec_seq);
    return;
  case 5:
    predict_or_learn_regcb<false>(data,base,ec_seq);
    return;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    poVar2 = std::operator<<(&local_1a0,
                             "Unknown explorer type specified for contextual bandit learning: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pvVar3 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/cb_explore_adf.cc"
               ,0x2a8,&local_1d0);
    __cxa_throw(pvVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
}

Assistant:

void do_actual_learning(cb_explore_adf& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = test_adf_sequence(ec_seq);
  data.gen_cs.known_cost = CB_ADF::get_observed_cost(ec_seq);

  if (label_example == nullptr || !is_learn)
  {
    if (label_example != nullptr)  // extract label
    {
      data.action_label = label_example->l.cb;
      label_example->l.cb = data.empty_label;
    }
    switch (data.explore_type)
    {
      case EXPLORE_FIRST:
        predict_or_learn_first<false>(data, base, ec_seq);
        break;
      case EPS_GREEDY:
        predict_or_learn_greedy<false>(data, base, ec_seq);
        break;
      case SOFTMAX:
        predict_or_learn_softmax<false>(data, base, ec_seq);
        break;
      case BAG_EXPLORE:
        predict_or_learn_bag<false>(data, base, ec_seq);
        break;
      case COVER:
        predict_or_learn_cover<false>(data, base, ec_seq);
        break;
      case REGCB:
        predict_or_learn_regcb<false>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown explorer type specified for contextual bandit learning: " << data.explore_type);
    }
    if (label_example != nullptr)  // restore label
      label_example->l.cb = data.action_label;
  }
  else
  {
    /*	v_array<float> temp_probs;
    temp_probs = v_init<float>();
    do_actual_learning<false>(data,base);
    for (size_t i = 0; i < data.ec_seq[0]->pred.a_s.size(); i++)
    temp_probs.push_back(data.ec_seq[0]->pred.a_s[i].score);*/

    switch (data.explore_type)
    {
      case EXPLORE_FIRST:
        predict_or_learn_first<is_learn>(data, base, ec_seq);
        break;
      case EPS_GREEDY:
        predict_or_learn_greedy<is_learn>(data, base, ec_seq);
        break;
      case SOFTMAX:
        predict_or_learn_softmax<is_learn>(data, base, ec_seq);
        break;
      case BAG_EXPLORE:
        predict_or_learn_bag<is_learn>(data, base, ec_seq);
        break;
      case COVER:
        predict_or_learn_cover<is_learn>(data, base, ec_seq);
        break;
      case REGCB:
        predict_or_learn_regcb<is_learn>(data, base, ec_seq);
        break;
      default:
        THROW("Unknown explorer type specified for contextual bandit learning: " << data.explore_type);
    }

    /*	for (size_t i = 0; i < temp_probs.size(); i++)
      if (temp_probs[i] != data.ec_seq[0]->pred.a_s[i].score)
        cout << "problem! " << temp_probs[i] << " != " << data.ec_seq[0]->pred.a_s[i].score << " for " <<
      data.ec_seq[0]->pred.a_s[i].action << endl; temp_probs.delete_v();*/
  }
}